

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_NtkFree(Sfm_Ntk_t *p)

{
  Vec_Str_t *__ptr;
  char *__ptr_00;
  Vec_Wrd_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wec_t *pVVar5;
  word *__ptr_01;
  long lVar6;
  long lVar7;
  
  __ptr = p->vFixed;
  if (__ptr->pArray != (char *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (char *)0x0;
  }
  if (__ptr != (Vec_Str_t *)0x0) {
    free(__ptr);
  }
  if (p->vEmpty != (Vec_Str_t *)0x0) {
    __ptr_00 = p->vEmpty->pArray;
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
      p->vEmpty->pArray = (char *)0x0;
    }
    if (p->vEmpty != (Vec_Str_t *)0x0) {
      free(p->vEmpty);
      p->vEmpty = (Vec_Str_t *)0x0;
    }
  }
  pVVar1 = p->vTruths;
  if (pVVar1->pArray != (word *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (word *)0x0;
  }
  if (pVVar1 != (Vec_Wrd_t *)0x0) {
    free(pVVar1);
  }
  if (0 < (p->vFanins).nCap) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      pvVar2 = *(void **)((long)&((p->vFanins).pArray)->nCap + lVar6);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&((p->vFanins).pArray)->nCap + lVar6) = 0;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (p->vFanins).nCap);
  }
  pVVar3 = (p->vFanins).pArray;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
    (p->vFanins).pArray = (Vec_Int_t *)0x0;
  }
  (p->vFanins).nCap = 0;
  (p->vFanins).nSize = 0;
  pVVar3 = p->vStarts;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar1 = p->vTruths2;
  if (pVVar1->pArray != (word *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (word *)0x0;
  }
  if (pVVar1 != (Vec_Wrd_t *)0x0) {
    free(pVVar1);
  }
  if (0 < (p->vFanouts).nCap) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      pvVar2 = *(void **)((long)&((p->vFanouts).pArray)->nCap + lVar6);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&((p->vFanouts).pArray)->nCap + lVar6) = 0;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (p->vFanouts).nCap);
  }
  pVVar3 = (p->vFanouts).pArray;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
    (p->vFanouts).pArray = (Vec_Int_t *)0x0;
  }
  (p->vFanouts).nCap = 0;
  (p->vFanouts).nSize = 0;
  piVar4 = (p->vLevels).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar4 = (p->vLevelsR).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vLevelsR).pArray = (int *)0x0;
  }
  piVar4 = (p->vCounts).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vCounts).pArray = (int *)0x0;
  }
  piVar4 = (p->vTravIds).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar4 = (p->vTravIds2).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vTravIds2).pArray = (int *)0x0;
  }
  piVar4 = (p->vId2Var).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vId2Var).pArray = (int *)0x0;
  }
  piVar4 = (p->vVar2Id).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vVar2Id).pArray = (int *)0x0;
  }
  pVVar5 = p->vCnfs;
  if (0 < pVVar5->nCap) {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->pArray->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar5->pArray->nCap + lVar7) = 0;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < pVVar5->nCap);
  }
  if (pVVar5->pArray != (Vec_Int_t *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (Vec_Int_t *)0x0;
  }
  pVVar5->nCap = 0;
  pVVar5->nSize = 0;
  free(pVVar5);
  pVVar3 = p->vCover;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  if (p->vNodes != (Vec_Int_t *)0x0) {
    piVar4 = p->vNodes->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vNodes->pArray = (int *)0x0;
    }
    if (p->vNodes != (Vec_Int_t *)0x0) {
      free(p->vNodes);
      p->vNodes = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDivs != (Vec_Int_t *)0x0) {
    piVar4 = p->vDivs->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vDivs->pArray = (int *)0x0;
    }
    if (p->vDivs != (Vec_Int_t *)0x0) {
      free(p->vDivs);
      p->vDivs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vRoots != (Vec_Int_t *)0x0) {
    piVar4 = p->vRoots->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vRoots->pArray = (int *)0x0;
    }
    if (p->vRoots != (Vec_Int_t *)0x0) {
      free(p->vRoots);
      p->vRoots = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTfo != (Vec_Int_t *)0x0) {
    piVar4 = p->vTfo->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vTfo->pArray = (int *)0x0;
    }
    if (p->vTfo != (Vec_Int_t *)0x0) {
      free(p->vTfo);
      p->vTfo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDivCexes != (Vec_Wrd_t *)0x0) {
    __ptr_01 = p->vDivCexes->pArray;
    if (__ptr_01 != (word *)0x0) {
      free(__ptr_01);
      p->vDivCexes->pArray = (word *)0x0;
    }
    if (p->vDivCexes != (Vec_Wrd_t *)0x0) {
      free(p->vDivCexes);
      p->vDivCexes = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vOrder != (Vec_Int_t *)0x0) {
    piVar4 = p->vOrder->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vOrder->pArray = (int *)0x0;
    }
    if (p->vOrder != (Vec_Int_t *)0x0) {
      free(p->vOrder);
      p->vOrder = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDivVars != (Vec_Int_t *)0x0) {
    piVar4 = p->vDivVars->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vDivVars->pArray = (int *)0x0;
    }
    if (p->vDivVars != (Vec_Int_t *)0x0) {
      free(p->vDivVars);
      p->vDivVars = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDivIds != (Vec_Int_t *)0x0) {
    piVar4 = p->vDivIds->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vDivIds->pArray = (int *)0x0;
    }
    if (p->vDivIds != (Vec_Int_t *)0x0) {
      free(p->vDivIds);
      p->vDivIds = (Vec_Int_t *)0x0;
    }
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    piVar4 = p->vLits->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vLits->pArray = (int *)0x0;
    }
    if (p->vLits != (Vec_Int_t *)0x0) {
      free(p->vLits);
      p->vLits = (Vec_Int_t *)0x0;
    }
  }
  if (p->vValues != (Vec_Int_t *)0x0) {
    piVar4 = p->vValues->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vValues->pArray = (int *)0x0;
    }
    if (p->vValues != (Vec_Int_t *)0x0) {
      free(p->vValues);
      p->vValues = (Vec_Int_t *)0x0;
    }
  }
  pVVar5 = p->vClauses;
  if (pVVar5 != (Vec_Wec_t *)0x0) {
    if (0 < pVVar5->nCap) {
      lVar7 = 8;
      lVar6 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar5->pArray->nCap + lVar7);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          *(undefined8 *)((long)&pVVar5->pArray->nCap + lVar7) = 0;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 < pVVar5->nCap);
    }
    if (pVVar5->pArray != (Vec_Int_t *)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (Vec_Int_t *)0x0;
    }
    pVVar5->nCap = 0;
    pVVar5->nSize = 0;
    free(pVVar5);
    p->vClauses = (Vec_Wec_t *)0x0;
  }
  if (p->vFaninMap != (Vec_Int_t *)0x0) {
    piVar4 = p->vFaninMap->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vFaninMap->pArray = (int *)0x0;
    }
    if (p->vFaninMap != (Vec_Int_t *)0x0) {
      free(p->vFaninMap);
      p->vFaninMap = (Vec_Int_t *)0x0;
    }
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p != (Sfm_Ntk_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sfm_NtkFree( Sfm_Ntk_t * p )
{
    // user data
    Vec_StrFree( p->vFixed );
    Vec_StrFreeP( &p->vEmpty );
    Vec_WrdFree( p->vTruths );
    Vec_WecErase( &p->vFanins );
    Vec_IntFree( p->vStarts );
    Vec_WrdFree( p->vTruths2 );
    // attributes
    Vec_WecErase( &p->vFanouts );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vLevelsR.pArray );
    ABC_FREE( p->vCounts.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vTravIds2.pArray );
    ABC_FREE( p->vId2Var.pArray );
    ABC_FREE( p->vVar2Id.pArray );
    Vec_WecFree( p->vCnfs );
    Vec_IntFree( p->vCover );
    // other data
    Vec_IntFreeP( &p->vNodes );
    Vec_IntFreeP( &p->vDivs  );
    Vec_IntFreeP( &p->vRoots );
    Vec_IntFreeP( &p->vTfo   );
    Vec_WrdFreeP( &p->vDivCexes );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vDivVars );
    Vec_IntFreeP( &p->vDivIds );
    Vec_IntFreeP( &p->vLits  );
    Vec_IntFreeP( &p->vValues );
    Vec_WecFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vFaninMap );
    if ( p->pSat  ) sat_solver_delete( p->pSat );
    ABC_FREE( p );
}